

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::
Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
::Matcher(Matcher<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
          *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value)

{
  pointer pwVar1;
  Buffer BVar2;
  long *local_80;
  long local_78;
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  MatcherBase<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
  local_40;
  
  (this->
  super_MatcherBase<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
  ).vtable_ = (VTable *)0x0;
  (this->
  super_MatcherBase<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001f2df8;
  pwVar1 = (value->_M_dataplus)._M_p;
  local_80 = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_80,pwVar1,pwVar1 + value->_M_string_length);
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)local_60,local_80,(long)local_80 + local_78 * 4);
  local_40.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001f2e68;
  local_40.vtable_ =
       (VTable *)
       internal::MatcherBase<std::__cxx11::wstring_const&>::
       GetVTable<testing::internal::MatcherBase<std::__cxx11::wstring_const&>::ValuePolicy<testing::internal::EqMatcher<std::__cxx11::wstring>,false>>()
       ::kVTable_abi_cxx11_;
  BVar2.ptr = operator_new(0x28);
  ((BVar2.shared)->ref).super___atomic_base<int>._M_i = 1;
  std::__cxx11::wstring::wstring((wstring *)(BVar2.i + 8),(wstring *)local_60);
  local_40.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001f2df8;
  local_40.buffer_.ptr = BVar2.ptr;
  internal::
  MatcherBase<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
  ::operator=(&this->
               super_MatcherBase<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
              ,&local_40);
  internal::
  MatcherBase<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
  ::~MatcherBase(&local_40);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] * 4 + 4);
  }
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }